

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_read_regex_options_order(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *flags;
  char *pattern;
  bson_t b;
  bson_error_t error;
  char *local_390;
  undefined1 local_388 [8];
  undefined1 local_380 [224];
  undefined1 local_2a0 [8];
  undefined1 local_298 [640];
  
  cVar1 = bson_init_from_json(local_380,"{\"a\": {\"$regex\": \"\", \"$options\": \"ism\"}}",
                              0xffffffffffffffff,local_2a0);
  if (cVar1 == '\0') {
    uVar3 = 0x48b;
  }
  else {
    uVar3 = bson_bcone_magic();
    bcon_extract(local_380,"a",uVar3,10,local_388,&local_390,0);
    pcVar5 = local_390;
    if (local_390 != "ims") {
      iVar2 = strcmp(local_390,"ims");
      if (iVar2 != 0) {
        pcVar4 = "ims";
        goto LAB_00122a30;
      }
    }
    bson_destroy(local_380);
    cVar1 = bson_init_from_json(local_380,"{\"a\": {\"$regex\": \"\", \"$options\": \"misl\"}}",
                                0xffffffffffffffff,local_2a0);
    if (cVar1 != '\0') {
      bcon_extract(local_380,"a",uVar3,10,local_388,&local_390,0);
      if (local_390 != "ilms") {
        iVar2 = strcmp(local_390,"ilms");
        if (iVar2 != 0) {
          pcVar4 = "ilms";
          pcVar5 = local_390;
LAB_00122a30:
          fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar5,pcVar4);
          abort();
        }
      }
      bson_destroy(local_380);
      return;
    }
    uVar3 = 0x493;
  }
  fprintf(_stderr,"FAIL:%s:%d  %s()\n  %s\n  %s\n\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar3,"test_bson_json_read_regex_options_order","r",local_298);
  fflush(_stderr);
  abort();
}

Assistant:

static void
test_bson_json_read_regex_options_order (void)
{
   bson_t b;
   bson_error_t error;
   bool r;
   const char *pattern;
   const char *flags;

   r = bson_init_from_json (
      &b, "{\"a\": {\"$regex\": \"\", \"$options\": \"ism\"}}", -1, &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "a", BCONE_REGEX (pattern, flags));
   ASSERT_CMPSTR (flags, "ims");

   bson_destroy (&b);

   r = bson_init_from_json (
      &b, "{\"a\": {\"$regex\": \"\", \"$options\": \"misl\"}}", -1, &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "a", BCONE_REGEX (pattern, flags));
   ASSERT_CMPSTR (flags, "ilms");

   bson_destroy (&b);
}